

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void function(ch_compilation *comp)

{
  uint8_t last_scope_size;
  byte bVar1;
  ch_emit_scope *blob;
  _Bool _Var2;
  ch_dataptr value;
  ch_scope *pcVar3;
  char cVar4;
  ulong uVar5;
  ch_op op;
  ch_token name;
  ch_emit_scope emit_scope;
  ch_scope locals_scope;
  ch_token local_1a88;
  ch_emit *local_1a68;
  ch_token local_1a60;
  ch_emit_scope local_1a40;
  ch_scope local_1a20;
  
  memset(&local_1a20,0,0x19f0);
  local_1a20.parent = comp->scope;
  comp->scope = &local_1a20;
  consume(comp,TK_POUND,"Expected start of function.",(ch_token *)0x0);
  _Var2 = consume(comp,TK_ID,"Expected function name.",&local_1a60);
  if (_Var2) {
    local_1a68 = &comp->emit;
    ch_emit_create_scope(local_1a68,&local_1a40);
    last_scope_size = comp->scope->locals_size;
    cVar4 = '\0';
    consume(comp,TK_POPEN,"Expected (.",(ch_token *)0x0);
    do {
      if ((comp->current).kind == TK_PCLOSE) {
        cVar4 = -cVar4;
LAB_00103353:
        consume(comp,TK_PCLOSE,"Expected ).",(ch_token *)0x0);
        goto LAB_00103369;
      }
      if (cVar4 == '\x02') {
        error(comp,"Exceeded argument limit.");
        cVar4 = -1;
        goto LAB_00103353;
      }
      _Var2 = consume(comp,TK_ID,"Expected variable name.",&local_1a88);
      if (!_Var2) break;
      pcVar3 = comp->scope;
      bVar1 = pcVar3->locals_size;
      pcVar3->locals_size = bVar1 + 1;
      pcVar3->locals[bVar1].name.start = local_1a88.lexeme.start;
      pcVar3->locals[bVar1].name.size = local_1a88.lexeme.size;
      pcVar3->locals[bVar1].is_captured = false;
      if ((comp->current).kind != TK_PCLOSE) {
        consume(comp,TK_COMMA,"Expected comma.",(ch_token *)0x0);
      }
      cVar4 = cVar4 + -1;
    } while (_Var2);
    cVar4 = '\0';
LAB_00103369:
    scope(comp);
    end_scope(comp,last_scope_size);
    local_1a88.kind = TK_DO;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a88,1);
    value = ch_emit_commit_scope(local_1a68);
    local_1a88.kind = TK_TRUE;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a88,1);
    ch_uint32_to_le_array(value,(uint8_t *)&local_1a88);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a88,4);
    local_1a88.kind = CONCAT31(local_1a88.kind._1_3_,cVar4);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a88,1);
    blob = (comp->emit).emit_scope;
    if (blob->parent != (ch_emit_scope *)0x0) {
      local_1a88.kind = TK_EOF;
      ch_emit_write(&blob->bytecode,&local_1a88,1);
      local_1a88.kind = CONCAT31(local_1a88.kind._1_3_,comp->scope->upvalue_count);
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a88,1);
      pcVar3 = comp->scope;
      if (pcVar3->upvalue_count != '\0') {
        uVar5 = 0;
        do {
          local_1a88.kind._0_1_ = pcVar3->upvalues[uVar5].is_local;
          ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a88,1);
          local_1a88.kind = CONCAT31(local_1a88.kind._1_3_,pcVar3->upvalues[uVar5].offset);
          ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a88,1);
          uVar5 = uVar5 + 1;
          pcVar3 = comp->scope;
        } while (uVar5 < pcVar3->upvalue_count);
      }
    }
    comp->scope = comp->scope->parent;
    add_variable(comp,local_1a60.lexeme);
  }
  return;
}

Assistant:

void function(ch_compilation *comp) {
  ch_scope locals_scope = new_localscope();
  locals_scope.parent = comp->scope;
  comp->scope = &locals_scope;

  consume(comp, TK_POUND, "Expected start of function.", NULL);
  ch_token name;
  if (!consume(comp, TK_ID, "Expected function name.", &name))
    return;

  ch_emit_scope emit_scope;
  ch_emit_create_scope(&comp->emit, &emit_scope);

  uint8_t scope_mark = begin_scope(comp);
  ch_argcount argcount = function_arglist(comp);
  scope(comp);
  end_scope(comp, scope_mark);

  // Ensure that all functions return
  EMIT_OP(GET_EMIT(comp), OP_RETURN_VOID);

  ch_dataptr function_ptr = ch_emit_commit_scope(&comp->emit);

  EMIT_OP(GET_EMIT(comp), OP_FUNCTION);
  EMIT_PTR(GET_EMIT(comp), function_ptr);
  EMIT_ARGCOUNT(GET_EMIT(comp), argcount);

  if (!CH_EMITTING_GLOBALLY(GET_EMIT(comp))) {
    closure(comp);
  }

  comp->scope = comp->scope->parent;
  add_variable(comp, name.lexeme);
}